

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_waitany_(MPIABI_Fint *count,MPIABI_Fint *array_of_requests,int *index,
                    MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  mpi_waitany_();
  return;
}

Assistant:

void mpiabi_waitany_(
  const MPIABI_Fint * count,
  MPIABI_Fint * array_of_requests,
  int * index,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_waitany_(
    count,
    array_of_requests,
    index,
    status,
    ierror
  );
}